

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_POW(Context *ctx)

{
  char local_118 [8];
  char code [128];
  char src1 [64];
  char src0 [64];
  Context *ctx_local;
  
  make_METAL_srcarg_string_masked(ctx,0,src1 + 0x38,0x40);
  make_METAL_srcarg_string_masked(ctx,1,code + 0x78,0x40);
  ctx->metal_need_header_math = 1;
  make_METAL_destarg_assign(ctx,local_118,0x80,"pow(abs(%s), %s)",src1 + 0x38,code + 0x78);
  output_line(ctx,"%s",local_118);
  return;
}

Assistant:

static void emit_METAL_POW(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];
    ctx->metal_need_header_math = 1;
    make_METAL_destarg_assign(ctx, code, sizeof (code),
                             "pow(abs(%s), %s)", src0, src1);
    output_line(ctx, "%s", code);
}